

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5b5eb::OpenXrProgram::PollEvents
          (OpenXrProgram *this,bool *exitRenderLoop,bool *requestRestart)

{
  XrEventDataBuffer *pXVar1;
  XrStructureType XVar2;
  XrSessionState e;
  XrAction pXVar3;
  XrSession pXVar4;
  undefined8 uVar5;
  XrSession pXVar6;
  XrResult XVar7;
  char *pcVar8;
  char *pcVar9;
  XrEventDataEventsLost *eventsLost;
  allocator local_69;
  XrSessionBeginInfo sessionBeginInfo;
  
  *requestRestart = false;
  *exitRenderLoop = false;
  pXVar1 = &this->m_eventDataBuffer;
  do {
    while( true ) {
      (this->m_eventDataBuffer).type = XR_TYPE_EVENT_DATA_BUFFER;
      (this->m_eventDataBuffer).next = (void *)0x0;
      XVar7 = xrPollEvent(this->m_instance,pXVar1);
      if (XVar7 != XR_SUCCESS) {
        if (XVar7 == XR_EVENT_UNAVAILABLE) {
          return;
        }
        ThrowXrResult(XVar7,"\"xrPollEvent\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:694"
                     );
      }
      XVar2 = pXVar1->type;
      if (XVar2 == XR_TYPE_EVENT_DATA_EVENTS_LOST) {
        Fmt_abi_cxx11_((string *)&sessionBeginInfo,"%d events lost",
                       (ulong)*(uint *)(this->m_eventDataBuffer).varying);
        Log::Write(Warning,(string *)&sessionBeginInfo);
        std::__cxx11::string::~string((string *)&sessionBeginInfo);
        XVar2 = pXVar1->type;
      }
      if (XVar2 == XR_TYPE_EVENT_DATA_SESSION_STATE_CHANGED) break;
      if (XVar2 == XR_TYPE_EVENT_DATA_INTERACTION_PROFILE_CHANGED) {
        pXVar3 = (this->m_input).grabAction;
        std::__cxx11::string::string((string *)&sessionBeginInfo,"Grab",&local_69);
        LogActionSourceName(this,pXVar3,(string *)&sessionBeginInfo);
        std::__cxx11::string::~string((string *)&sessionBeginInfo);
        pXVar3 = (this->m_input).quitAction;
        std::__cxx11::string::string((string *)&sessionBeginInfo,"Quit",&local_69);
        LogActionSourceName(this,pXVar3,(string *)&sessionBeginInfo);
        std::__cxx11::string::~string((string *)&sessionBeginInfo);
        pXVar3 = (this->m_input).poseAction;
        std::__cxx11::string::string((string *)&sessionBeginInfo,"Pose",&local_69);
        LogActionSourceName(this,pXVar3,(string *)&sessionBeginInfo);
        std::__cxx11::string::~string((string *)&sessionBeginInfo);
        pXVar3 = (this->m_input).vibrateAction;
        std::__cxx11::string::string((string *)&sessionBeginInfo,"Vibrate",&local_69);
        LogActionSourceName(this,pXVar3,(string *)&sessionBeginInfo);
      }
      else {
        if (XVar2 == XR_TYPE_EVENT_DATA_INSTANCE_LOSS_PENDING) {
          Fmt_abi_cxx11_((string *)&sessionBeginInfo,"XrEventDataInstanceLossPending by %lld",
                         *(undefined8 *)(this->m_eventDataBuffer).varying);
          Log::Write(Warning,(string *)&sessionBeginInfo);
          std::__cxx11::string::~string((string *)&sessionBeginInfo);
          *exitRenderLoop = true;
          *requestRestart = true;
          return;
        }
        Fmt_abi_cxx11_((string *)&sessionBeginInfo,"Ignoring event type %d");
        Log::Write(Verbose,(string *)&sessionBeginInfo);
      }
LAB_0010dfbc:
      std::__cxx11::string::~string((string *)&sessionBeginInfo);
    }
    pXVar4 = *(XrSession *)(this->m_eventDataBuffer).varying;
    uVar5 = *(undefined8 *)((this->m_eventDataBuffer).varying + 0x10);
    e = this->m_sessionState;
    this->m_sessionState = *(XrSessionState *)((this->m_eventDataBuffer).varying + 8);
    pcVar8 = to_string(e);
    pcVar9 = to_string(this->m_sessionState);
    Fmt_abi_cxx11_((string *)&sessionBeginInfo,
                   "XrEventDataSessionStateChanged: state %s->%s session=%lld time=%lld",pcVar8,
                   pcVar9,pXVar4,uVar5);
    Log::Write(Info,(string *)&sessionBeginInfo);
    std::__cxx11::string::~string((string *)&sessionBeginInfo);
    pXVar6 = this->m_session;
    if (pXVar4 != pXVar6 && pXVar4 != (XrSession)0x0) {
      std::__cxx11::string::string
                ((string *)&sessionBeginInfo,"XrEventDataSessionStateChanged for unknown session",
                 &local_69);
      Log::Write(Error,(string *)&sessionBeginInfo);
      goto LAB_0010dfbc;
    }
    switch(this->m_sessionState) {
    case XR_SESSION_STATE_READY:
      if (pXVar6 == (XrSession)0x0) {
        std::__cxx11::string::string((string *)&sessionBeginInfo,"Check failed",&local_69);
        Throw((string *)&sessionBeginInfo,"m_session != XR_NULL_HANDLE",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:745"
             );
      }
      sessionBeginInfo.type = XR_TYPE_SESSION_BEGIN_INFO;
      sessionBeginInfo._4_4_ = 0;
      sessionBeginInfo.next._0_4_ = 0;
      sessionBeginInfo.next._4_4_ = 0;
      sessionBeginInfo._20_4_ = 0;
      sessionBeginInfo.primaryViewConfigurationType =
           (((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->Parsed).ViewConfigType;
      XVar7 = xrBeginSession(pXVar6,(string *)&sessionBeginInfo);
      CheckXrResult(XVar7,"xrBeginSession(m_session, &sessionBeginInfo)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:748"
                   );
      this->m_sessionRunning = true;
      break;
    case XR_SESSION_STATE_STOPPING:
      if (pXVar6 == (XrSession)0x0) {
        std::__cxx11::string::string((string *)&sessionBeginInfo,"Check failed",&local_69);
        Throw((string *)&sessionBeginInfo,"m_session != XR_NULL_HANDLE",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:753"
             );
      }
      this->m_sessionRunning = false;
      XVar7 = xrEndSession();
      CheckXrResult(XVar7,"xrEndSession(m_session)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:755"
                   );
      break;
    case XR_SESSION_STATE_LOSS_PENDING:
      *exitRenderLoop = true;
      *requestRestart = true;
      break;
    case XR_SESSION_STATE_EXITING:
      *exitRenderLoop = true;
      *requestRestart = false;
    }
  } while( true );
}

Assistant:

void PollEvents(bool* exitRenderLoop, bool* requestRestart) override {
        *exitRenderLoop = *requestRestart = false;

        // Process all pending messages.
        while (const XrEventDataBaseHeader* event = TryReadNextEvent()) {
            switch (event->type) {
                case XR_TYPE_EVENT_DATA_INSTANCE_LOSS_PENDING: {
                    const auto& instanceLossPending = *reinterpret_cast<const XrEventDataInstanceLossPending*>(event);
                    Log::Write(Log::Level::Warning, Fmt("XrEventDataInstanceLossPending by %lld", instanceLossPending.lossTime));
                    *exitRenderLoop = true;
                    *requestRestart = true;
                    return;
                }
                case XR_TYPE_EVENT_DATA_SESSION_STATE_CHANGED: {
                    auto sessionStateChangedEvent = *reinterpret_cast<const XrEventDataSessionStateChanged*>(event);
                    HandleSessionStateChangedEvent(sessionStateChangedEvent, exitRenderLoop, requestRestart);
                    break;
                }
                case XR_TYPE_EVENT_DATA_INTERACTION_PROFILE_CHANGED:
                    LogActionSourceName(m_input.grabAction, "Grab");
                    LogActionSourceName(m_input.quitAction, "Quit");
                    LogActionSourceName(m_input.poseAction, "Pose");
                    LogActionSourceName(m_input.vibrateAction, "Vibrate");
                    break;
                case XR_TYPE_EVENT_DATA_REFERENCE_SPACE_CHANGE_PENDING:
                default: {
                    Log::Write(Log::Level::Verbose, Fmt("Ignoring event type %d", event->type));
                    break;
                }
            }
        }
    }